

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O1

int64_t __thiscall
llvm::DataExtractor::getSigned(DataExtractor *this,uint64_t *offset_ptr,uint32_t byte_size)

{
  ulong uVar1;
  unsigned_short uVar2;
  uint uVar3;
  unsigned_long uVar4;
  int64_t iVar5;
  
  switch(byte_size) {
  case 1:
    uVar1 = *offset_ptr;
    if ((uVar1 == 0xffffffffffffffff) || ((this->Data).Length <= uVar1)) {
      iVar5 = 0;
      unexpectedEndReached((Error *)0x0);
    }
    else {
      iVar5 = (int64_t)(this->Data).Data[uVar1];
      *offset_ptr = uVar1 + 1;
    }
    break;
  case 2:
    uVar2 = getU<unsigned_short>
                      (offset_ptr,this,this->IsLittleEndian != '\0',(this->Data).Data,(Error *)0x0);
    iVar5 = (int64_t)(short)uVar2;
    break;
  default:
    llvm_unreachable_internal
              ("getSigned unhandled case!",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DataExtractor.cpp"
               ,0x97);
  case 4:
    uVar3 = getU<unsigned_int>(offset_ptr,this,this->IsLittleEndian != '\0',(this->Data).Data,
                               (Error *)0x0);
    iVar5 = (int64_t)(int)uVar3;
    break;
  case 8:
    uVar4 = getU<unsigned_long>(offset_ptr,this,this->IsLittleEndian != '\0',(this->Data).Data,
                                (Error *)0x0);
    return uVar4;
  }
  return iVar5;
}

Assistant:

int64_t
DataExtractor::getSigned(uint64_t *offset_ptr, uint32_t byte_size) const {
  switch (byte_size) {
  case 1:
    return (int8_t)getU8(offset_ptr);
  case 2:
    return (int16_t)getU16(offset_ptr);
  case 4:
    return (int32_t)getU32(offset_ptr);
  case 8:
    return (int64_t)getU64(offset_ptr);
  }
  llvm_unreachable("getSigned unhandled case!");
}